

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O1

int __thiscall cbtQuantizedBvh::calcSplittingAxis(cbtQuantizedBvh *this,int startIndex,int endIndex)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar11;
  undefined1 auVar9 [16];
  undefined8 uVar12;
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  float fVar13;
  undefined1 auVar14 [64];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  cbtVector3 cVar19;
  cbtVector3 cVar20;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  
  fVar8 = 0.0;
  fVar16 = 0.0;
  fVar17 = 0.0;
  fVar18 = 0.0;
  auVar14 = ZEXT1664(ZEXT816(0) << 0x40);
  fVar13 = 0.0;
  iVar5 = startIndex;
  if (endIndex - startIndex != 0 && startIndex <= endIndex) {
    do {
      uVar12 = in_ZMM0._8_8_;
      cVar19 = getAabbMax(this,iVar5);
      uVar11 = uVar12;
      cVar20 = getAabbMin(this,iVar5);
      local_48 = cVar19.m_floats[0];
      fStack_44 = cVar19.m_floats[1];
      fStack_40 = (float)uVar12;
      fStack_3c = (float)((ulong)uVar12 >> 0x20);
      auVar9._0_4_ = cVar20.m_floats[0] + local_48;
      auVar9._4_4_ = cVar20.m_floats[1] + fStack_44;
      auVar9._8_4_ = (float)uVar11 + fStack_40;
      auVar9._12_4_ = (float)((ulong)uVar11 >> 0x20) + fStack_3c;
      auVar1 = vmovshdup_avx(auVar9);
      local_38 = cVar19.m_floats[2];
      fVar8 = fVar16 + auVar9._0_4_ * 0.5;
      fVar17 = fVar18 + auVar1._0_4_ * 0.5;
      fVar13 = (cVar20.m_floats[2] + local_38) * 0.5;
      in_ZMM0 = ZEXT464((uint)fVar13);
      fVar13 = auVar14._0_4_ + fVar13;
      auVar14 = ZEXT464((uint)fVar13);
      iVar5 = iVar5 + 1;
      fVar16 = fVar8;
      fVar18 = fVar17;
    } while (endIndex != iVar5);
  }
  fVar6 = (float)(endIndex - startIndex);
  fVar18 = 0.0;
  fVar15 = 0.0;
  fVar16 = 0.0;
  if (startIndex < endIndex) {
    fVar7 = 1.0 / fVar6;
    fVar15 = 0.0;
    fVar18 = 0.0;
    fVar16 = 0.0;
    do {
      uVar12 = 0;
      cVar19 = getAabbMax(this,startIndex);
      uVar11 = uVar12;
      cVar20 = getAabbMin(this,startIndex);
      local_48 = cVar19.m_floats[0];
      fStack_44 = cVar19.m_floats[1];
      fStack_40 = (float)uVar12;
      fStack_3c = (float)((ulong)uVar12 >> 0x20);
      auVar10._0_4_ = cVar20.m_floats[0] + local_48;
      auVar10._4_4_ = cVar20.m_floats[1] + fStack_44;
      auVar10._8_4_ = (float)uVar11 + fStack_40;
      auVar10._12_4_ = (float)((ulong)uVar11 >> 0x20) + fStack_3c;
      auVar1 = vmovshdup_avx(auVar10);
      local_38 = cVar19.m_floats[2];
      fVar2 = auVar10._0_4_ * 0.5 - fVar7 * fVar8;
      fVar3 = auVar1._0_4_ * 0.5 - fVar7 * fVar17;
      fVar4 = (cVar20.m_floats[2] + local_38) * 0.5 - fVar7 * fVar13;
      fVar16 = fVar16 + fVar2 * fVar2;
      fVar18 = fVar18 + fVar3 * fVar3;
      fVar15 = fVar15 + fVar4 * fVar4;
      startIndex = startIndex + 1;
    } while (endIndex != startIndex);
  }
  fVar8 = 1.0 / (fVar6 + -1.0);
  iVar5 = (uint)(fVar8 * fVar16 < fVar8 * fVar15) * 2;
  if (fVar8 * fVar16 < fVar8 * fVar18) {
    iVar5 = (fVar8 * fVar18 < fVar8 * fVar15) + 1;
  }
  return iVar5;
}

Assistant:

int cbtQuantizedBvh::calcSplittingAxis(int startIndex, int endIndex)
{
	int i;

	cbtVector3 means(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
	cbtVector3 variance(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
	int numIndices = endIndex - startIndex;

	for (i = startIndex; i < endIndex; i++)
	{
		cbtVector3 center = cbtScalar(0.5) * (getAabbMax(i) + getAabbMin(i));
		means += center;
	}
	means *= (cbtScalar(1.) / (cbtScalar)numIndices);

	for (i = startIndex; i < endIndex; i++)
	{
		cbtVector3 center = cbtScalar(0.5) * (getAabbMax(i) + getAabbMin(i));
		cbtVector3 diff2 = center - means;
		diff2 = diff2 * diff2;
		variance += diff2;
	}
	variance *= (cbtScalar(1.) / ((cbtScalar)numIndices - 1));

	return variance.maxAxis();
}